

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O0

void __thiscall Pl_Base64::flush_decode(Pl_Base64 *this)

{
  runtime_error *prVar1;
  Pipeline *pPVar2;
  size_t sVar3;
  int local_c8;
  uchar local_c4;
  uchar local_c3;
  uchar local_c2;
  undefined1 local_c1;
  undefined1 local_c0 [4];
  uchar out [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  char local_7d;
  int local_7c;
  char ch;
  ulong uStack_78;
  int v;
  size_t i;
  int local_68;
  int outval;
  int shift;
  int pad;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Pl_Base64 *local_10;
  Pl_Base64 *this_local;
  
  local_10 = this;
  if ((this->end_of_data & 1U) != 0) {
    shift._3_1_ = 1;
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    Pipeline::getIdentifier_abi_cxx11_(&local_50,&this->super_Pipeline);
    std::operator+(&local_30,&local_50,": base64 decode: data follows pad characters");
    std::runtime_error::runtime_error(prVar1,(string *)&local_30);
    shift._3_1_ = 0;
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  outval = 0;
  local_68 = 0x12;
  i._4_4_ = 0;
  uStack_78 = 0;
  do {
    if (3 < uStack_78) {
      local_c4 = to_uc((int)i._4_4_ >> 0x10);
      local_c3 = to_uc((int)i._4_4_ >> 8 & 0xff);
      local_c2 = to_uc(i._4_4_ & 0xff);
      pPVar2 = Pipeline::next(&this->super_Pipeline);
      local_c8 = 3 - outval;
      sVar3 = QIntC::to_size<int>(&local_c8);
      (*pPVar2->_vptr_Pipeline[2])(pPVar2,&local_c4,sVar3);
      return;
    }
    local_7c = 0;
    local_7d = to_c((uint)this->buf[uStack_78]);
    if ((local_7d < 'A') || ('Z' < local_7d)) {
      if ((local_7d < 'a') || ('z' < local_7d)) {
        if ((local_7d < '0') || ('9' < local_7d)) {
          if ((local_7d == '+') || (local_7d == '-')) {
            local_7c = 0x3e;
          }
          else if ((local_7d == '/') || (local_7d == '_')) {
            local_7c = 0x3f;
          }
          else {
            if ((local_7d != '=') ||
               ((uStack_78 != 3 && ((uStack_78 != 2 || (this->buf[3] != '=')))))) {
              local_c1 = 1;
              prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
              Pipeline::getIdentifier_abi_cxx11_((string *)local_c0,&this->super_Pipeline);
              std::operator+(&local_a0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_c0,": base64 decode: invalid input");
              std::runtime_error::runtime_error(prVar1,(string *)&local_a0);
              local_c1 = 0;
              __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            outval = outval + 1;
            this->end_of_data = true;
            local_7c = 0;
          }
        }
        else {
          local_7c = local_7d + 4;
        }
      }
      else {
        local_7c = local_7d + -0x47;
      }
    }
    else {
      local_7c = local_7d + -0x41;
    }
    i._4_4_ = local_7c << ((byte)local_68 & 0x1f) | i._4_4_;
    local_68 = local_68 + -6;
    uStack_78 = uStack_78 + 1;
  } while( true );
}

Assistant:

void
Pl_Base64::flush_decode()
{
    if (this->end_of_data) {
        throw std::runtime_error(getIdentifier() + ": base64 decode: data follows pad characters");
    }
    int pad = 0;
    int shift = 18;
    int outval = 0;
    for (size_t i = 0; i < 4; ++i) {
        int v = 0;
        char ch = to_c(this->buf[i]);
        if ((ch >= 'A') && (ch <= 'Z')) {
            v = ch - 'A';
        } else if ((ch >= 'a') && (ch <= 'z')) {
            v = ch - 'a' + 26;
        } else if ((ch >= '0') && (ch <= '9')) {
            v = ch - '0' + 52;
        } else if ((ch == '+') || (ch == '-')) {
            v = 62;
        } else if ((ch == '/') || (ch == '_')) {
            v = 63;
        } else if ((ch == '=') && ((i == 3) || ((i == 2) && (this->buf[3] == '=')))) {
            ++pad;
            this->end_of_data = true;
            v = 0;
        } else {
            throw std::runtime_error(getIdentifier() + ": base64 decode: invalid input");
        }
        outval |= v << shift;
        shift -= 6;
    }
    unsigned char out[3] = {
        to_uc(outval >> 16),
        to_uc(0xff & (outval >> 8)),
        to_uc(0xff & outval),
    };

    next()->write(out, QIntC::to_size(3 - pad));
}